

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O3

void __thiscall Vault::Config::Config(Config *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer local_48;
  size_type local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  this->tls_ = true;
  this->debug_ = false;
  this->verify_ = true;
  (this->connectTimeout_).value_ = 10;
  (this->requestTimeout_).value_ = 10;
  (this->lowSpeedTimeout_).value_ = 10;
  (this->lowSpeedLimit_).value_ = 0x3c;
  local_48 = (pointer)&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"localhost","");
  paVar1 = &(this->host_).value_.field_2;
  (this->host_).value_._M_dataplus._M_p = (pointer)paVar1;
  if (local_48 == (pointer)&local_38) {
    *(undefined4 *)paVar1 = local_38;
    *(undefined4 *)((long)&(this->host_).value_.field_2 + 4) = uStack_34;
    *(undefined4 *)((long)&(this->host_).value_.field_2 + 8) = uStack_30;
    *(undefined4 *)((long)&(this->host_).value_.field_2 + 0xc) = uStack_2c;
  }
  else {
    (this->host_).value_._M_dataplus._M_p = local_48;
    (this->host_).value_.field_2._M_allocated_capacity = CONCAT44(uStack_34,local_38);
  }
  (this->host_).value_._M_string_length = local_40;
  local_48 = (pointer)&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"8200","");
  paVar1 = &(this->port_).value_.field_2;
  (this->port_).value_._M_dataplus._M_p = (pointer)paVar1;
  if (local_48 == (pointer)&local_38) {
    *(undefined4 *)paVar1 = local_38;
    *(undefined4 *)((long)&(this->port_).value_.field_2 + 4) = uStack_34;
    *(undefined4 *)((long)&(this->port_).value_.field_2 + 8) = uStack_30;
    *(undefined4 *)((long)&(this->port_).value_.field_2 + 0xc) = uStack_2c;
  }
  else {
    (this->port_).value_._M_dataplus._M_p = local_48;
    (this->port_).value_.field_2._M_allocated_capacity = CONCAT44(uStack_34,local_38);
  }
  (this->port_).value_._M_string_length = local_40;
  local_48 = (pointer)&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  paVar1 = &(this->ns_).value_.field_2;
  (this->ns_).value_._M_dataplus._M_p = (pointer)paVar1;
  if (local_48 == (pointer)&local_38) {
    paVar1->_M_allocated_capacity = CONCAT44(uStack_34,local_38);
    *(ulong *)((long)&(this->ns_).value_.field_2 + 8) = CONCAT44(uStack_2c,uStack_30);
  }
  else {
    (this->ns_).value_._M_dataplus._M_p = local_48;
    (this->ns_).value_.field_2._M_allocated_capacity = CONCAT44(uStack_34,local_38);
  }
  (this->ns_).value_._M_string_length = local_40;
  Catch::clara::std::filesystem::__cxx11::path::path(&this->caBundle_);
  return;
}

Assistant:

Config()
      : tls_(true), debug_(false), verify_(true), connectTimeout_(Timeout{10}),
        requestTimeout_(Timeout{10}), lowSpeedTimeout_(Timeout{10}),
        lowSpeedLimit_(Threshold{60}), host_(Host{"localhost"}),
        port_(Port{"8200"}), ns_(""), caBundle_() {}